

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O2

void llhttp__debug(llhttp_t *s,char *p,char *endp,char *msg)

{
  if (p == endp) {
    fprintf(_stderr,"p=%p type=%d flags=%02x next=null debug=%s\n",s,(ulong)s->type,(ulong)s->flags,
            msg);
    return;
  }
  fprintf(_stderr,"p=%p type=%d flags=%02x next=%02x   debug=%s\n",s,(ulong)s->type,(ulong)s->flags,
          (ulong)(uint)(int)*p,msg);
  return;
}

Assistant:

void llhttp__debug(llhttp_t* s, const char* p, const char* endp,
                   const char* msg) {
  if (p == endp) {
    fprintf(stderr, "p=%p type=%d flags=%02x next=null debug=%s\n", s, s->type,
            s->flags, msg);
  } else {
    fprintf(stderr, "p=%p type=%d flags=%02x next=%02x   debug=%s\n", s,
            s->type, s->flags, *p, msg);
  }
}